

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O0

void __thiscall Fverb::set_parameter(Fverb *this,uint index,float value)

{
  type pBVar1;
  mydsp *dsp;
  float value_local;
  uint index_local;
  Fverb *this_local;
  
  pBVar1 = std::unique_ptr<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>::operator*
                     (&this->fDsp);
  switch(index) {
  case 0:
    *(float *)((long)&pBVar1[0x10007]._vptr_BasicDsp + 4) = value;
    break;
  case 1:
    *(float *)&pBVar1[5]._vptr_BasicDsp = value;
    break;
  case 2:
    *(float *)((long)&pBVar1[0x10009]._vptr_BasicDsp + 4) = value;
    break;
  case 3:
    *(float *)&pBVar1[0x1000c]._vptr_BasicDsp = value;
    break;
  case 4:
    *(float *)((long)&pBVar1[0x1000e]._vptr_BasicDsp + 4) = value;
    break;
  case 5:
    *(float *)&pBVar1[0x10413]._vptr_BasicDsp = value;
    break;
  case 6:
    *(float *)&pBVar1[0x11018]._vptr_BasicDsp = value;
    break;
  case 7:
    *(float *)((long)&pBVar1[2]._vptr_BasicDsp + 4) = value;
    break;
  case 8:
    *(float *)&pBVar1[0x25024]._vptr_BasicDsp = value;
    break;
  case 9:
    *(float *)&pBVar1[0x2101b]._vptr_BasicDsp = value;
    break;
  case 10:
    *(float *)((long)&pBVar1[0x21019]._vptr_BasicDsp + 4) = value;
  }
  return;
}

Assistant:

void Fverb::set_parameter(unsigned index, float value) noexcept
{
    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    switch (index) {

    case 0:
        dsp.fHslider2 = value;
        break;

    case 1:
        dsp.fHslider1 = value;
        break;

    case 2:
        dsp.fHslider3 = value;
        break;

    case 3:
        dsp.fHslider4 = value;
        break;

    case 4:
        dsp.fHslider5 = value;
        break;

    case 5:
        dsp.fHslider6 = value;
        break;

    case 6:
        dsp.fHslider7 = value;
        break;

    case 7:
        dsp.fHslider0 = value;
        break;

    case 8:
        dsp.fHslider10 = value;
        break;

    case 9:
        dsp.fHslider9 = value;
        break;

    case 10:
        dsp.fHslider8 = value;
        break;

    default:
        (void)dsp;
        (void)value;
        break;
    }
}